

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O1

void __thiscall
eos::morphablemodel::MorphableModel::serialize<cereal::BinaryInputArchive>
          (MorphableModel *this,BinaryInputArchive *archive,uint32_t version)

{
  BinaryInputArchive *pBVar1;
  pointer paVar2;
  runtime_error *prVar3;
  array<double,_2UL> *v;
  pointer data;
  size_type size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_60;
  NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
  local_50;
  NameValuePair<std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_&>
  local_40;
  
  switch(version) {
  case 0:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "The model file you are trying to load is in an old format. Please download the most recent model files."
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 1:
    PcaModel::serialize<cereal::BinaryInputArchive>
              (&this->shape_model,
               (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self);
    PcaModel::serialize<cereal::BinaryInputArchive>
              (&this->color_model,
               (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self);
    pBVar1 = (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::BinaryInputArchive,_1U>).self;
    cereal::BinaryInputArchive::loadBinary
              ((((((((pBVar1->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self,&local_a0,8);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
              (&this->texture_coordinates,(size_type)local_a0._M_dataplus._M_p);
    paVar2 = (this->texture_coordinates).
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (data = (this->texture_coordinates).
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start; data != paVar2; data = data + 1) {
      cereal::BinaryInputArchive::loadBinary
                ((((((((pBVar1->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                     super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self,data,0x10);
    }
    break;
  case 2:
    local_a0._M_dataplus._M_p = "shape_model";
    local_80._M_string_length = (size_type)&this->color_model;
    local_80._M_dataplus._M_p = "color_model";
    local_50.value = &this->expression_model;
    local_50.name = "expression_model";
    local_60.value = &this->texture_coordinates;
    local_60.name = "texture_coordinates";
    local_a0._M_string_length = (size_type)this;
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::
    process<cereal::NameValuePair<eos::morphablemodel::PcaModel&>,cereal::NameValuePair<eos::morphablemodel::PcaModel&>,cereal::NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>&>,cereal::NameValuePair<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>>
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_a0,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_80,&local_50,&local_60);
    break;
  case 3:
    local_a0._M_string_length = (size_type)&this->landmark_definitions;
    local_a0._M_dataplus._M_p = "landmark_definitions";
    local_80._M_string_length = (size_type)&this->texture_coordinates;
    local_80._M_dataplus._M_p = "texture_coordinates";
    PcaModel::serialize<cereal::BinaryInputArchive>
              (&this->shape_model,
               (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self);
    PcaModel::serialize<cereal::BinaryInputArchive>
              (&this->color_model,
               (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self);
    cereal::
    load<cereal::BinaryInputArchive,std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
              ((((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self,&this->expression_model);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::
    process<cereal::NameValuePair<std::optional<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>&>,cereal::NameValuePair<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>>
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<std::optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_&>
                *)&local_a0,
               (NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
                *)&local_80);
    break;
  case 4:
    local_a0._M_string_length = (size_type)&this->color_model;
    local_a0._M_dataplus._M_p = "color_model";
    local_80._M_string_length = (size_type)&this->expression_model;
    local_80._M_dataplus._M_p = "expression_model";
    local_50.value = (Type)&this->landmark_definitions;
    local_50.name = "landmark_definitions";
    local_60.value = &this->texture_coordinates;
    local_60.name = "texture_coordinates";
    local_40.value = &this->texture_triangle_indices;
    local_40.name = "texture_triangle_indices";
    PcaModel::serialize<cereal::BinaryInputArchive>
              (&this->shape_model,
               (((((((archive->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                   super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::
    process<cereal::NameValuePair<eos::morphablemodel::PcaModel&>,cereal::NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>&>,cereal::NameValuePair<std::optional<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>&>,cereal::NameValuePair<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>,cereal::NameValuePair<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>&>>
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_a0,
               (NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
                *)&local_80,
               (NameValuePair<std::optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_&>
                *)&local_50,&local_60,&local_40);
    break;
  default:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_80,version);
    std::operator+(&local_a0,"The model file you are trying to load has an unknown version number: "
                   ,&local_80);
    std::runtime_error::runtime_error(prVar3,(string *)&local_a0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void serialize(Archive& archive, const std::uint32_t version)
    {
        if (version < 1)
        {
            throw std::runtime_error("The model file you are trying to load is in an old format. Please "
                                     "download the most recent model files.");
        }
        if (version == 1)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(texture_coordinates));
        } else if (version == 2)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(texture_coordinates));
        } else if (version == 3)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates));
        } else if (version == 4)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates),
                    CEREAL_NVP(texture_triangle_indices));
        } else
        {
            throw std::runtime_error("The model file you are trying to load has an unknown version number: " +
                                     std::to_string(version));
        }
    }